

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PaddingLayerParams_PaddingReflection::MergeFrom
          (PaddingLayerParams_PaddingReflection *this,PaddingLayerParams_PaddingReflection *from)

{
  LogMessage *other;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  PaddingLayerParams_PaddingReflection *local_18;
  PaddingLayerParams_PaddingReflection *from_local;
  PaddingLayerParams_PaddingReflection *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x6c63);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void PaddingLayerParams_PaddingReflection::MergeFrom(const PaddingLayerParams_PaddingReflection& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.PaddingLayerParams.PaddingReflection)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}